

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void cpool_remove_conn(cpool *cpool,connectdata *conn)

{
  cpool_bundle *pcVar1;
  cpool_bundle *bundle_00;
  size_t sVar2;
  cpool_bundle *bundle;
  Curl_llist *list;
  connectdata *conn_local;
  cpool *cpool_local;
  
  pcVar1 = (cpool_bundle *)Curl_node_llist(&conn->cpool_node);
  if (((pcVar1 != (cpool_bundle *)0x0) &&
      (bundle_00 = cpool_find_bundle(cpool,conn), bundle_00 != (cpool_bundle *)0x0)) &&
     (pcVar1 == bundle_00)) {
    cpool_bundle_remove(bundle_00,conn);
    sVar2 = Curl_llist_count(&bundle_00->conns);
    if (sVar2 == 0) {
      cpool_remove_bundle(cpool,bundle_00);
    }
    conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffdffffffff);
    cpool->num_conn = cpool->num_conn - 1;
  }
  return;
}

Assistant:

static void cpool_remove_conn(struct cpool *cpool,
                              struct connectdata *conn)
{
  struct Curl_llist *list = Curl_node_llist(&conn->cpool_node);
  DEBUGASSERT(cpool);
  if(list) {
    /* The connection is certainly in the pool, but where? */
    struct cpool_bundle *bundle = cpool_find_bundle(cpool, conn);
    if(bundle && (list == &bundle->conns)) {
      cpool_bundle_remove(bundle, conn);
      if(!Curl_llist_count(&bundle->conns))
        cpool_remove_bundle(cpool, bundle);
      conn->bits.in_cpool = FALSE;
      cpool->num_conn--;
    }
    else {
      /* Not in  a bundle, already in the shutdown list? */
      DEBUGASSERT(list == &cpool->shutdowns);
    }
  }
}